

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  size_t i;
  ulong uVar1;
  long lVar2;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)&local_50);
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (ulong)(*(long *)(this + 8) - *(long *)this >> 3); uVar1 = uVar1 + 1) {
    Type::GetName_abi_cxx11_(&local_50,(Type *)(*(long *)this + lVar2));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    if (uVar1 < (*(long *)(this + 8) - *(long *)this >> 3) - 1U) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    lVar2 = lVar2 + 8;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += types[i].GetName();
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}